

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbrush.cpp
# Opt level: O0

void __thiscall VBrush::VBrush(VBrush *this,VGradient *gradient)

{
  int *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  memset((VColor *)(in_RDI + 2),0,4);
  VColor::VColor((VColor *)(in_RDI + 2));
  if (in_RSI != (int *)0x0) {
    *(int **)(in_RDI + 2) = in_RSI;
    if (*in_RSI == 0) {
      *in_RDI = 2;
    }
    else if (*in_RSI == 1) {
      *in_RDI = 3;
    }
  }
  return;
}

Assistant:

VBrush::VBrush(const VGradient *gradient)
{
    if (!gradient) return;

    mGradient = gradient;

    if (gradient->mType == VGradient::Type::Linear) {
        mType = VBrush::Type::LinearGradient;
    } else if (gradient->mType == VGradient::Type::Radial) {
        mType = VBrush::Type::RadialGradient;
    }
}